

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O3

void sph_soln<FNV1A64x8>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *keywords,vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *permutedKeywords,
                        vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  pointer pbVar5;
  pointer pbVar6;
  ulong uVar7;
  long lVar8;
  string identifier;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  printf("const char* Keyword[ %lu ] = { ",
         (long)(permutedKeywords->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(permutedKeywords->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(std::__cxx11::string)_1_>
            ((permutedKeywords->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  puts("};");
  printf("enum Key { ");
  pbVar5 = (permutedKeywords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (permutedKeywords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar5) {
    uVar7 = 0;
    do {
      if (pbVar5[uVar7]._M_string_length != 0) {
        pcVar1 = pbVar5[uVar7]._M_dataplus._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + pbVar5[uVar7]._M_string_length);
        lVar3 = local_48;
        plVar2 = local_50;
        if (local_48 != 0) {
          lVar8 = 0;
          do {
            iVar4 = toupper((int)*(char *)((long)plVar2 + lVar8));
            *(char *)((long)plVar2 + lVar8) = (char)iVar4;
            lVar8 = lVar8 + 1;
          } while (lVar3 != lVar8);
        }
        printf("%s=%u, ",local_50,uVar7);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        pbVar5 = (permutedKeywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (permutedKeywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < (ulong)((long)pbVar6 - (long)pbVar5 >> 5));
  }
  puts("};");
  printf("const %s Hash[ %lu ] = { ","uint64_t",
         (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3);
  std::
  for_each<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(unsigned_long_const&)_1_>
            ((hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  puts("};");
  printf("const %s Mixtable[ %lu ] = { ","uint8_t",
         (long)(mixTable->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(mixTable->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start);
  std::
  for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(unsigned_char_const&)_1_>
            ((mixTable->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (mixTable->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  puts("};");
  putchar(10);
  return;
}

Assistant:

void sph_soln(const vector<string> &keywords, const vector<typename T::Key> &mixTable, const vector<string> &permutedKeywords, const vector<typename T::Hash> &hashes)
{
    printf("const char* Keyword[ %lu ] = { ", permutedKeywords.size());
    for_each(permutedKeywords.begin(), permutedKeywords.end(), [] (const string s) {
        if(s.length() > 0)
            printf("\"%s\", ", s.data());
        else
            printf("0, ");
    } );
    printf("};\n");

    printf("enum Key { ");
    for( uint pk = 0; pk < permutedKeywords.size(); pk++ )
        if(permutedKeywords[pk].length() > 0)
        {
            string identifier = permutedKeywords[ pk ];
            for_each(identifier.begin(), identifier.end(), [](string::value_type& c ) { c = toupper(c); } );
            printf("%s=%u, ", identifier.data(), pk);
        }
    printf("};\n");

    printf("const %s Hash[ %lu ] = { ", val_type(static_cast<typename T::Hash>(0)), hashes.size());
    for_each(hashes.begin(), hashes.end(), [] (const typename T::Hash & h) { cout << val_hex(h) << ", "; } );
    printf("};\n");

    printf("const %s Mixtable[ %lu ] = { ", val_type(static_cast<typename T::Key>(0)), mixTable.size());
    for_each(mixTable.begin(), mixTable.end(), [] (const typename T::Key & k) { cout << val_hex(k) << ", "; } );
    printf("};\n");
    printf("\n");
}